

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

QString * visibleAsciiOrHex(QString *__return_storage_ptr__,UINT8 *bytes,UINT32 length)

{
  uint uVar1;
  bool bVar2;
  QString local_98;
  uint local_80;
  UINT32 j;
  QString local_70;
  uint local_54;
  undefined1 local_50 [4];
  UINT32 i;
  QString hexString;
  QString asciiString;
  bool ascii;
  UINT32 length_local;
  UINT8 *bytes_local;
  
  bVar2 = true;
  QString::QString((QString *)&hexString.d.size);
  QString::QString((QString *)local_50);
  for (local_54 = 0; local_54 < length; local_54 = local_54 + 1) {
    usprintf(&local_70,"%02X",(ulong)bytes[local_54]);
    QString::operator+=((QString *)local_50,&local_70);
    QString::~QString(&local_70);
    if (((bVar2) && (local_54 != 0)) && (uVar1 = local_54, bytes[local_54] == '\0')) {
      do {
        local_80 = uVar1 + 1;
        if (length <= local_80) goto LAB_00186b86;
        uVar1 = local_80;
      } while (bytes[local_80] == '\0');
      bVar2 = false;
LAB_00186b86:
      if (bVar2) break;
    }
    else if ((bytes[local_54] < 0x20) || (0x7e < bytes[local_54])) {
      bVar2 = false;
    }
    if (bVar2) {
      usprintf(&local_98,"%c",(ulong)bytes[local_54]);
      QString::operator+=((QString *)&hexString.d.size,&local_98);
      QString::~QString(&local_98);
    }
  }
  if (bVar2) {
    QString::QString(__return_storage_ptr__,(QString *)&hexString.d.size);
  }
  else {
    QString::QString(__return_storage_ptr__,(QString *)local_50);
  }
  QString::~QString((QString *)local_50);
  QString::~QString((QString *)&hexString.d.size);
  return __return_storage_ptr__;
}

Assistant:

UString visibleAsciiOrHex(UINT8* bytes, UINT32 length)
{
    bool ascii = true;
    UString asciiString;
    UString hexString;
    
    for (UINT32 i = 0; i < length; i++) {
        hexString += usprintf("%02X", bytes[i]);
        
        if (ascii && i > 0 && bytes[i] == '\x00') { // Check for the rest of the buffer being zeroes, and make the whole previous string visible, if so
            for (UINT32 j = i + 1; j < length; j++) {
                if (bytes[j] != '\x00') {
                    ascii = false;
                    break;
                }
            }
            
            if (ascii) {
                // No need to continue iterating over every symbol, we did it already
                break;
            }
        }
        else if (bytes[i] < '\x20' || bytes[i] > '\x7E') {  // Explicit ascii codes to avoid locale dependency
            ascii = false;
        }
        
        if (ascii) {
            asciiString += usprintf("%c", bytes[i]);
        }
    }
    
    if (ascii) {
        return asciiString;
    }
    
    return hexString;
}